

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O0

int corpus_get_xfrm(float32 *****out_a,float32 ****out_b,uint32 **out_veclen,uint32 *out_n_mllrcls,
                   uint32 *out_n_stream)

{
  int32 iVar1;
  char local_1038 [8];
  char mllrfn [4096];
  uint32 *out_n_stream_local;
  uint32 *out_n_mllrcls_local;
  uint32 **out_veclen_local;
  float32 ****out_b_local;
  float32 *****out_a_local;
  
  if (data_dir[3] == (char *)0x0) {
    strcpy(local_1038,mllr_line);
  }
  else {
    sprintf(local_1038,"%s/%s",data_dir[3],mllr_line);
  }
  iVar1 = read_reg_mat(local_1038,out_veclen,out_n_mllrcls,out_n_stream,out_a,out_b);
  if (iVar1 != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
            ,0x5f6,"Unable to read %s\n",local_1038);
    exit(1);
  }
  return 0;
}

Assistant:

int
corpus_get_xfrm(float32 *****out_a,
		float32 ****out_b,
		uint32 **out_veclen,
		uint32 *out_n_mllrcls,
		uint32 *out_n_stream)
{
    char mllrfn[MAXPATHLEN];

    if (data_dir[DATA_TYPE_MLLR])
	sprintf(mllrfn, "%s/%s", data_dir[DATA_TYPE_MLLR], mllr_line);
    else {
	strcpy(mllrfn, mllr_line);
    }
    
    if (read_reg_mat(mllrfn,
	 	     out_veclen,
		     out_n_mllrcls,
		     out_n_stream,
		     out_a,
		     out_b) != S3_SUCCESS)
	E_FATAL("Unable to read %s\n",mllrfn);

    return S3_SUCCESS;
}